

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O1

ssize_t __thiscall diffusion::ShmWriter::write(ShmWriter *this,int __fd,void *__buf,size_t __n)

{
  uint32_t *puVar1;
  int iVar2;
  uint32_t uVar3;
  Size bytes_left;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  Size size_prefix;
  
  uVar5 = 4;
  do {
    iVar4 = (int)uVar5;
    iVar2 = this->shm_body_size_ - this->writer_shm_body_offset_;
    if (iVar4 < iVar2) {
      iVar2 = iVar4;
    }
    memcpy(this->shm_body_position_ + (int)this->writer_shm_body_offset_,
           &stack0xffffffffffffffd0 + -uVar5,(long)iVar2);
    uVar3 = this->writer_shm_body_offset_ + iVar2;
    if (uVar3 == this->shm_body_size_) {
      uVar3 = 0;
    }
    this->writer_shm_body_offset_ = uVar3;
    uVar5 = (ulong)(uint)(iVar4 - iVar2);
  } while (iVar4 - iVar2 != 0 && iVar2 <= iVar4);
  cyclic_write(this,(char *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  puVar1 = (uint32_t *)this->shm_header_position_;
  *puVar1 = this->writer_shm_body_offset_;
  return (ssize_t)puVar1;
}

Assistant:

void ShmWriter::write(char const *data, std::size_t size) {
    auto size_prefix = static_cast<Size>(size);
    this->cyclic_write(reinterpret_cast<char const *>(&size_prefix), sizeof(size_prefix));
    this->cyclic_write(data, size);
    this->commit();
}